

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDFATest.cpp
# Opt level: O2

void __thiscall
Microsoft::VisualStudio::CppUnitTestFramework::LDFATest::LDFAConstructionTest(LDFATest *this)

{
  int iVar1;
  allocator local_191;
  int lookup_result;
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  local_188;
  LookaheadDFA<char> ldfa;
  undefined1 local_150 [24];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_138;
  size_type sStack_128;
  float local_120;
  size_t local_118;
  __node_base_ptr p_Stack_110;
  pointer pIStack_108;
  pointer pIStack_100;
  pointer local_f8;
  undefined **local_f0;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_d8;
  undefined **local_c8;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_b0;
  undefined **local_a0;
  __node_base_ptr *local_90;
  size_type local_88;
  __node_base local_80;
  size_type sStack_78;
  float local_70;
  size_t local_68;
  __node_base_ptr p_Stack_60;
  CompositeATN<char> catn;
  
  Logger::WriteMessage("Starting test.\n");
  local_150._16_8_ = &p_Stack_110;
  local_150._0_8_ = &PTR__Grammar_001b1ca0;
  local_e8._M_p = (pointer)&local_d8;
  local_c0._M_p = (pointer)&local_b0;
  local_138._M_allocated_capacity = 1;
  local_138._8_8_ = (_Hash_node_base *)0x0;
  sStack_128 = 0;
  local_120 = 1.0;
  local_118 = 0;
  p_Stack_110 = (__node_base_ptr)0x0;
  pIStack_108 = (pointer)0x0;
  pIStack_100 = (pointer)0x0;
  local_f8 = (pointer)0x0;
  local_f0 = &PTR__Identifier_001b1d28;
  local_e0 = 0;
  local_d8._M_local_buf[0] = L'\0';
  local_c8 = &PTR__Identifier_001b1d28;
  local_b8 = 0;
  local_b0._M_local_buf[0] = L'\0';
  local_90 = &p_Stack_60;
  local_88 = 1;
  local_80._M_nxt = (_Hash_node_base *)0x0;
  sStack_78 = 0;
  local_70 = 1.0;
  local_68 = 0;
  p_Stack_60 = (__node_base_ptr)0x0;
  local_a0 = &PTR__GrammarOptions_001b1d58;
  Centaurus::Grammar<char>::parse((Grammar<char> *)local_150,"../../grammar/json.cgr",1);
  Centaurus::CompositeATN<char>::CompositeATN(&catn,(Grammar<char> *)local_150);
  Centaurus::Grammar<char>::~Grammar((Grammar<char> *)local_150);
  Logger::WriteMessage("CATN loaded.\n");
  Centaurus::Identifier::Identifier((Identifier *)local_150,L"Object");
  Centaurus::ATNPath::ATNPath((ATNPath *)&lookup_result,(Identifier *)local_150,0);
  Centaurus::LookaheadDFA<char>::LookaheadDFA(&ldfa,&catn,(ATNPath *)&lookup_result,true);
  std::
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ::~vector(&local_188);
  Centaurus::Identifier::~Identifier((Identifier *)local_150);
  std::__cxx11::string::string((string *)local_150,"{}",&local_191);
  iVar1 = Centaurus::LookaheadDFA<char>::run
                    (&ldfa,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_150,0,0);
  std::__cxx11::string::~string((string *)local_150);
  local_150._0_4_ = 4;
  lookup_result = iVar1;
  Assert::AreEqual<int>((int *)local_150,&lookup_result,(wchar_t *)0x0);
  Centaurus::NFABase<Centaurus::LDFAState<char>_>::~NFABase
            (&ldfa.super_NFABase<Centaurus::LDFAState<char>_>);
  Centaurus::CompositeATN<char>::~CompositeATN(&catn);
  return;
}

Assistant:

TEST_METHOD(LDFAConstructionTest)
	{
        Logger::WriteMessage("Starting test.\n");

		Centaurus::CompositeATN<char> catn = LoadCATN("../../grammar/json.cgr");

        Logger::WriteMessage("CATN loaded.\n");

		Centaurus::LookaheadDFA<char> ldfa(catn, Centaurus::ATNPath(L"Object", 0));

		int lookup_result = ldfa.run("{}", 0, 0);

		Assert::AreEqual(4, lookup_result);
	}